

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void generate_random_data(uint16_t *data,uint32_t n)

{
  result_type rVar1;
  uint uVar2;
  size_t __i;
  long lVar3;
  ulong uVar4;
  uniform_int_distribution<unsigned_short> distr;
  mt19937 eng;
  random_device rd;
  param_type local_2744;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar2 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar2;
  lVar3 = 1;
  uVar4 = local_2740._M_x[0];
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3);
    local_2740._M_x[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_2740._M_p = 0x270;
  local_2744._M_a = 0;
  local_2744._M_b = 0xfffe;
  if (n != 0) {
    uVar4 = 0;
    do {
      rVar1 = std::uniform_int_distribution<unsigned_short>::operator()
                        ((uniform_int_distribution<unsigned_short> *)&local_2744,&local_2740,
                         &local_2744);
      data[uVar4] = rVar1;
      uVar4 = uVar4 + 1;
    } while (n != uVar4);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void generate_random_data(uint16_t* data, uint32_t n) {
    std::random_device rd; // obtain a random number from hardware
    std::mt19937 eng(rd()); // seed the generator

    std::uniform_int_distribution<uint16_t> distr(0, std::numeric_limits<uint16_t>::max()-1); // right inclusive

    for (int i = 0; i < n; ++i) {
        data[i] = distr(eng);
    }
}